

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  int iVar1;
  char **ppcVar2;
  Schema *pSVar3;
  sqlite3_vtab *psVar4;
  ushort uVar5;
  int iVar6;
  VtabCtx *pVVar7;
  VTable *pVTab;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  Schema **ppSVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  char *zErr;
  VtabCtx sCtx;
  Column *local_80;
  short local_78;
  char *local_58;
  VtabCtx local_50;
  
  iVar1 = (pTab->u).tab.addColOffset;
  local_58 = (char *)0x0;
  ppcVar2 = (pTab->u).vtab.azArg;
  for (pVVar7 = db->pVtabCtx; pVVar7 != (VtabCtx *)0x0; pVVar7 = pVVar7->pPrior) {
    if (pVVar7->pTab == pTab) {
      pcVar8 = sqlite3MPrintf(db,"vtable constructor called recursively: %s",pTab->zName);
      *pzErr = pcVar8;
      return 6;
    }
  }
  pcVar8 = sqlite3DbStrDup(db,pTab->zName);
  iVar6 = 7;
  if (pcVar8 != (char *)0x0) {
    pVTab = (VTable *)sqlite3Malloc(0x30);
    if (pVTab == (VTable *)0x0) {
      sqlite3OomFault(db);
      iVar6 = 7;
    }
    else {
      pVTab->pVtab = (sqlite3_vtab *)0x0;
      pVTab->nRef = 0;
      pVTab->bConstraint = '\0';
      pVTab->eVtabRisk = '\0';
      *(undefined2 *)&pVTab->field_0x1e = 0;
      *(undefined8 *)&pVTab->iSavepoint = 0;
      pVTab->pNext = (VTable *)0x0;
      pVTab->db = db;
      pVTab->pMod = pMod;
      pVTab->eVtabRisk = '\x01';
      if (pTab->pSchema == (Schema *)0x0) {
        lVar18 = -0x8000;
      }
      else {
        lVar18 = -0x100000000;
        ppSVar14 = &db->aDb->pSchema;
        do {
          lVar18 = lVar18 + 0x100000000;
          pSVar3 = *ppSVar14;
          ppSVar14 = ppSVar14 + 4;
        } while (pSVar3 != pTab->pSchema);
        lVar18 = lVar18 >> 0x20;
      }
      ((pTab->u).tab.pFKey)->pNextFrom = (FKey *)db->aDb[lVar18].zDbSName;
      local_50.pPrior = db->pVtabCtx;
      local_50.bDeclared = 0;
      db->pVtabCtx = &local_50;
      local_50.pVTable = pVTab;
      local_50.pTab = pTab;
      iVar6 = (*xConstruct)(db,pMod->pAux,iVar1,ppcVar2,&pVTab->pVtab,&local_58);
      db->pVtabCtx = local_50.pPrior;
      if (iVar6 == 0) {
        psVar4 = pVTab->pVtab;
        iVar6 = 0;
        if (psVar4 != (sqlite3_vtab *)0x0) {
          psVar4->pModule = (sqlite3_module *)0x0;
          *(undefined8 *)&psVar4->nRef = 0;
          psVar4->zErrMsg = (char *)0x0;
          pVTab->pVtab->pModule = pMod->pModule;
          pMod->nRefModule = pMod->nRefModule + 1;
          pVTab->nRef = 1;
          if (local_50.bDeclared == 0) {
            pcVar9 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",pTab->zName);
            *pzErr = pcVar9;
            sqlite3VtabUnlock(pVTab);
            iVar6 = 1;
          }
          else {
            pVTab->pNext = (VTable *)(pTab->u).tab.pDfltList;
            (pTab->u).vtab.p = pVTab;
            local_78 = pTab->nCol;
            if (0 < local_78) {
              local_80 = pTab->aCol;
              lVar18 = 0;
              uVar5 = 0;
              do {
                pcVar9 = sqlite3ColumnType(local_80 + lVar18,"");
                if (pcVar9 != (char *)0x0) {
                  sVar10 = strlen(pcVar9);
                  if ((sVar10 & 0x3fffffff) != 0) {
                    uVar11 = (ulong)((uint)sVar10 & 0x3fffffff);
                    uVar12 = 0;
                    pcVar15 = pcVar9;
LAB_0014e682:
                    if (pcVar9 == (char *)0x0) goto LAB_0014e6bf;
                    lVar16 = 0;
                    do {
                      if (""[(byte)"hidden"[lVar16]] != ""[(byte)pcVar15[lVar16]])
                      goto LAB_0014e6bf;
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != 6);
                    if (((uVar12 != 0) && (pcVar9[uVar12 - 1] != ' ')) ||
                       ((pcVar9[uVar12 + 6] & 0xdfU) != 0)) goto LAB_0014e6bf;
                    uVar13 = 7 - (pcVar9[uVar12 + 6] == 0);
                    uVar17 = uVar12;
                    if (uVar13 + (int)uVar12 <= ((uint)sVar10 & 0x3fffffff)) {
                      do {
                        pcVar9[uVar17] = pcVar9[uVar17 + uVar13];
                        lVar16 = uVar13 + uVar17;
                        uVar17 = uVar17 + 1;
                      } while (lVar16 + 1U <= uVar11);
                    }
                    if ((uVar12 != 0) && (pcVar9[uVar12] == '\0')) {
                      pcVar9[uVar12 - 1] = '\0';
                    }
                    local_80 = pTab->aCol;
                    local_80[lVar18].colFlags = local_80[lVar18].colFlags | 2;
                    *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 2;
                    local_78 = pTab->nCol;
                    uVar5 = 0x400;
                    goto LAB_0014e6d2;
                  }
                }
LAB_0014e6ca:
                pTab->tabFlags = pTab->tabFlags | (uint)uVar5;
LAB_0014e6d2:
                lVar18 = lVar18 + 1;
              } while (lVar18 < local_78);
              iVar6 = 0;
            }
          }
        }
      }
      else {
        if (iVar6 == 7) {
          sqlite3OomFault(db);
        }
        if (local_58 == (char *)0x0) {
          pcVar9 = sqlite3MPrintf(db,"vtable constructor failed: %s",pcVar8);
          *pzErr = pcVar9;
        }
        else {
          pcVar9 = sqlite3MPrintf(db,"%s");
          *pzErr = pcVar9;
          sqlite3_free(local_58);
        }
        sqlite3DbFreeNN(db,pVTab);
      }
    }
    sqlite3DbFreeNN(db,pcVar8);
  }
  return iVar6;
LAB_0014e6bf:
  uVar12 = uVar12 + 1;
  pcVar15 = pcVar15 + 1;
  if (uVar12 == uVar11) goto LAB_0014e6ca;
  goto LAB_0014e682;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db,
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg;
  int nArg = pTab->u.vtab.nArg;
  char *zErr = 0;
  char *zModuleName;
  int iDb;
  VtabCtx *pCtx;

  assert( IsVirtual(pTab) );
  azArg = (const char *const*)pTab->u.vtab.azArg;

  /* Check that the virtual-table is not already being initialized */
  for(pCtx=db->pVtabCtx; pCtx; pCtx=pCtx->pPrior){
    if( pCtx->pTab==pTab ){
      *pzErr = sqlite3MPrintf(db,
          "vtable constructor called recursively: %s", pTab->zName
      );
      return SQLITE_LOCKED;
    }
  }

  zModuleName = sqlite3DbStrDup(db, pTab->zName);
  if( !zModuleName ){
    return SQLITE_NOMEM_BKPT;
  }

  pVTable = sqlite3MallocZero(sizeof(VTable));
  if( !pVTable ){
    sqlite3OomFault(db);
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM_BKPT;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;
  pVTable->eVtabRisk = SQLITE_VTABRISK_Normal;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->u.vtab.azArg[1] = db->aDb[iDb].zDbSName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  db->pVtabCtx = sCtx.pPrior;
  if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
  assert( sCtx.pTab==pTab );

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pMod->nRefModule++;
    pVTable->nRef = 1;
    if( sCtx.bDeclared==0 ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, pTab->zName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      u16 oooHidden = 0;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->u.vtab.p. Then loop through the
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->u.vtab.p;
      pTab->u.vtab.p = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = sqlite3ColumnType(&pTab->aCol[iCol], "");
        int nType;
        int i = 0;
        nType = sqlite3Strlen30(zType);
        for(i=0; i<nType; i++){
          if( 0==sqlite3StrNICmp("hidden", &zType[i], 6)
           && (i==0 || zType[i-1]==' ')
           && (zType[i+6]=='\0' || zType[i+6]==' ')
          ){
            break;
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
          pTab->tabFlags |= TF_HasHidden;
          oooHidden = TF_OOOHidden;
        }else{
          pTab->tabFlags |= oooHidden;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}